

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O0

void __thiscall
SerialExecutionQueue::addJob(SerialExecutionQueue *this,QueueJob *job,QueueJobPriority param_2)

{
  SerialQueueImpl *this_00;
  anon_class_48_2_16dd914e local_78;
  function<void_()> local_48;
  uint64_t local_28;
  uint64_t jobID;
  QueueJob *pQStack_18;
  QueueJobPriority param_3_local;
  QueueJob *job_local;
  SerialExecutionQueue *this_local;
  
  local_78.jobID = this->jobCount + 1;
  this->jobCount = local_78.jobID;
  this_00 = this->queue;
  local_28 = local_78.jobID;
  jobID._4_4_ = param_2;
  pQStack_18 = job;
  job_local = (QueueJob *)this;
  llbuild::basic::QueueJob::QueueJob(&local_78.job,job);
  std::function<void()>::
  function<SerialExecutionQueue::addJob(llbuild::basic::QueueJob,llbuild::basic::QueueJobPriority)::_lambda()_1_,void>
            ((function<void()> *)&local_48,&local_78);
  anon_unknown.dwarf_3da423::SerialQueueImpl::async(this_00,&local_48);
  std::function<void_()>::~function(&local_48);
  addJob(llbuild::basic::QueueJob,llbuild::basic::QueueJobPriority)::{lambda()#1}::~QueueJobPriority
            ((_lambda___1_ *)&local_78);
  return;
}

Assistant:

virtual void addJob(QueueJob job, QueueJobPriority) override {
    uint64_t jobID = ++jobCount;
    queue->async([jobID, job]() mutable {
      SerialContext ctx(jobID, job);
      job.execute(&ctx);
    });
  }